

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O0

UChar __thiscall
icu_63::UCharCharacterIterator::setIndex(UCharCharacterIterator *this,int32_t position)

{
  int32_t position_local;
  UCharCharacterIterator *this_local;
  
  if (position < (this->super_CharacterIterator).begin) {
    (this->super_CharacterIterator).pos = (this->super_CharacterIterator).begin;
  }
  else if ((this->super_CharacterIterator).end < position) {
    (this->super_CharacterIterator).pos = (this->super_CharacterIterator).end;
  }
  else {
    (this->super_CharacterIterator).pos = position;
  }
  if ((this->super_CharacterIterator).pos < (this->super_CharacterIterator).end) {
    this_local._6_2_ = this->text[(this->super_CharacterIterator).pos];
  }
  else {
    this_local._6_2_ = L'\xffff';
  }
  return this_local._6_2_;
}

Assistant:

UChar
UCharCharacterIterator::setIndex(int32_t position) {
    if(position < begin) {
        pos = begin;
    } else if(position > end) {
        pos = end;
    } else {
        pos = position;
    }
    if(pos < end) {
        return text[pos];
    } else {
        return DONE;
    }
}